

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O1

void __thiscall llvm::dwarf::CFIProgram::addInstruction(CFIProgram *this,uint8_t Opcode)

{
  SmallVectorStorage<unsigned_long,_2U> *pSVar1;
  Instruction local_68;
  
  pSVar1 = &local_68.Ops.super_SmallVectorStorage<unsigned_long,_2U>;
  local_68.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  local_68.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity = 2;
  local_68.Expression.Storage.field_0.empty = '\0';
  local_68.Expression.Storage.hasVal = false;
  local_68.Opcode = Opcode;
  local_68.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX = pSVar1;
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::emplace_back<llvm::dwarf::CFIProgram::Instruction>(&this->Instructions,&local_68);
  if ((SmallVectorStorage<unsigned_long,_2U> *)
      local_68.Ops.super_SmallVectorImpl<unsigned_long>.
      super_SmallVectorTemplateBase<unsigned_long,_true>.
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX != pSVar1) {
    free(local_68.Ops.super_SmallVectorImpl<unsigned_long>.
         super_SmallVectorTemplateBase<unsigned_long,_true>.
         super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void addInstruction(uint8_t Opcode) {
    Instructions.push_back(Instruction(Opcode));
  }